

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.c
# Opt level: O1

OrthographicCamera *
create_ortho_camera(OrthographicCamera *__return_storage_ptr__,Vec3 pos,Vec3 target,float ratio,
                   float scale)

{
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  Vec3 v;
  Vec3 v_00;
  float fVar1;
  float fVar2;
  
  (__return_storage_ptr__->eye).x = (float)(int)pos._0_8_;
  (__return_storage_ptr__->eye).y = (float)(int)((ulong)pos._0_8_ >> 0x20);
  (__return_storage_ptr__->eye).z = pos.z;
  v.x = pos.x - target.x;
  v.y = pos.y - target.y;
  v.z = pos.z - target.z;
  fVar1 = norm(v);
  fVar6 = v.x / fVar1;
  fVar3 = v.y / fVar1;
  fVar1 = v.z / fVar1;
  __return_storage_ptr__->basis[2].x = fVar6;
  __return_storage_ptr__->basis[2].y = fVar3;
  __return_storage_ptr__->basis[2].z = fVar1;
  v_00.x = fVar1 * -0.000987 - fVar3;
  fVar4 = fVar6 - fVar1 * 0.00123;
  v_00.z = fVar3 * 0.00123 + fVar6 * 0.000987;
  v_00.y = fVar4;
  fVar2 = norm(v_00);
  fVar5 = v_00.x / fVar2;
  fVar4 = fVar4 / fVar2;
  fVar2 = v_00.z / fVar2;
  __return_storage_ptr__->basis[0].x = fVar5;
  __return_storage_ptr__->basis[0].y = fVar4;
  __return_storage_ptr__->basis[0].z = fVar2;
  __return_storage_ptr__->basis[1].x = fVar3 * fVar2 - fVar1 * fVar4;
  __return_storage_ptr__->basis[1].y = fVar1 * fVar5 - fVar2 * fVar6;
  __return_storage_ptr__->basis[1].z = fVar4 * fVar6 - fVar5 * fVar3;
  __return_storage_ptr__->xscale = ratio * scale;
  __return_storage_ptr__->yscale = scale;
  return __return_storage_ptr__;
}

Assistant:

OrthographicCamera create_ortho_camera(Vec3 pos, Vec3 target, float ratio, float scale) {
    OrthographicCamera rval;

    rval.eye = pos;
    rval.basis[2] = normalized(vsub(pos, target));
    rval.basis[0] = normalized(
        cross((Vec3) {0.00123f, -0.000987f, 1.0f}, rval.basis[2])
        );
    rval.basis[1] = cross(rval.basis[2], rval.basis[0]);

    rval.xscale = ratio * scale;
    rval.yscale = scale;

    return rval;
}